

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int arkSetPostprocessStepFn(void *arkode_mem,ARKPostProcessFn ProcessStep)

{
  int iVar1;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetPostprocessStepFn",
                    "arkode_mem = NULL illegal.");
  }
  else {
    *(ARKPostProcessFn *)((long)arkode_mem + 0x288) = ProcessStep;
    *(undefined8 *)((long)arkode_mem + 0x290) = *(undefined8 *)((long)arkode_mem + 0x10);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkSetPostprocessStepFn(void *arkode_mem,
                            ARKPostProcessFn ProcessStep)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetPostprocessStepFn", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* NULL argument sets default, otherwise set inputs */
  ark_mem->ProcessStep = ProcessStep;
  ark_mem->ps_data     = ark_mem->user_data;

  return(ARK_SUCCESS);
}